

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::MoveFromMemByRegToReg::TryToGenerateCode
          (MoveFromMemByRegToReg *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CExpression *pCVar1;
  CTemp *pCVar2;
  undefined8 local_130;
  CTempExpression *local_120;
  CMemExpression *local_110;
  CMoveStatement *local_100;
  CTemp local_f0;
  CExpression *local_d0;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_c8;
  pair<IRT::CTemp,_const_IRT::INode_*> local_a0;
  undefined1 local_78 [8];
  CTemp rightRegister;
  ConstTempPtr sourceRegPtr;
  ConstTempPtr addressPtr;
  ConstMemPtr sourceMemPtr;
  ConstMovePtr movePtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  MoveFromMemByRegToReg *this_local;
  
  if (tree == (INode *)0x0) {
    local_100 = (CMoveStatement *)0x0;
  }
  else {
    local_100 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
  }
  if (local_100 != (CMoveStatement *)0x0) {
    pCVar1 = CMoveStatement::Source(local_100);
    if (pCVar1 == (CExpression *)0x0) {
      local_110 = (CMemExpression *)0x0;
    }
    else {
      local_110 = (CMemExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    pCVar1 = CMoveStatement::Target(local_100);
    if (pCVar1 == (CExpression *)0x0) {
      local_120 = (CTempExpression *)0x0;
    }
    else {
      local_120 = (CTempExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    if ((local_110 != (CMemExpression *)0x0) && (local_120 != (CTempExpression *)0x0)) {
      pCVar1 = CMemExpression::getAddress(local_110);
      if (pCVar1 == (CExpression *)0x0) {
        local_130 = 0;
      }
      else {
        local_130 = __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      rightRegister._24_8_ = local_130;
      CTemp::CTemp((CTemp *)local_78);
      if (rightRegister._24_8_ == 0) {
        local_d0 = CMemExpression::getAddress(local_110);
        std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_c8,(CTemp *)local_78,&local_d0);
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_a0,&local_c8);
        std::
        vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
        ::push_back(children,&local_a0);
        std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_a0);
        std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_c8);
      }
      else {
        pCVar2 = CTempExpression::getTemprorary((CTempExpression *)rightRegister._24_8_);
        CTemp::operator=((CTemp *)local_78,pCVar2);
      }
      pCVar2 = CTempExpression::getTemprorary(local_120);
      std::make_shared<AssemblyCode::MoveToRegFromMemByReg,IRT::CTemp_const&,IRT::CTemp&>
                (&local_f0,pCVar2);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveToRegFromMemByReg>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveToRegFromMemByReg> *)&local_f0);
      std::shared_ptr<AssemblyCode::MoveToRegFromMemByReg>::~shared_ptr
                ((shared_ptr<AssemblyCode::MoveToRegFromMemByReg> *)&local_f0);
      CTemp::~CTemp((CTemp *)local_78);
      return true;
    }
  }
  return false;
}

Assistant:

bool
IRT::MoveFromMemByRegToReg::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                               AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr sourceMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Source( ));
        ConstTempPtr addressPtr = dynamic_cast<ConstTempPtr>(movePtr->Target( ));
        if ( sourceMemPtr && addressPtr ) {
            ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(sourceMemPtr->getAddress( ));
            CTemp rightRegister;
            if ( !sourceRegPtr ) {
                children.push_back( std::make_pair( rightRegister, sourceMemPtr->getAddress( )));
            } else {
                rightRegister = sourceRegPtr->getTemprorary( );
            }
            commands.emplace_back( std::make_shared<AssemblyCode::MoveToRegFromMemByReg>( addressPtr->getTemprorary( ),
                                                                                          rightRegister ));
            return true;
        }
    }
    return false;
}